

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.cpp
# Opt level: O3

pair<bool,_unsigned_long>
celero::RunAndCatchExc
          (TestFixture *test,uint64_t threads,uint64_t calls,
          shared_ptr<celero::TestFixture::ExperimentValue> *experimentValue)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  int iVar1;
  unsigned_long uVar2;
  undefined4 extraout_var_00;
  undefined8 unaff_R14;
  pair<bool,_unsigned_long> pVar3;
  undefined4 extraout_var;
  
  if (ExceptionSettings::instance::settings.catchExceptions == true) {
    this = (experimentValue->
           super___shared_ptr<celero::TestFixture::ExperimentValue,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this->_M_use_count = this->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this->_M_use_count = this->_M_use_count + 1;
      }
    }
    iVar1 = (*test->_vptr_TestFixture[8])();
    uVar2 = CONCAT44(extraout_var_00,iVar1);
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
  }
  else {
    iVar1 = (*test->_vptr_TestFixture[8])();
    uVar2 = CONCAT44(extraout_var,iVar1);
  }
  pVar3._0_8_ = CONCAT71((int7)((ulong)unaff_R14 >> 8),1) & 0xffffffff;
  pVar3.second = uVar2;
  return pVar3;
}

Assistant:

std::pair<bool, uint64_t> RunAndCatchExc(TestFixture& test, uint64_t threads, uint64_t calls,
											 std::shared_ptr<celero::TestFixture::ExperimentValue> experimentValue)
	{
		if(ExceptionSettings::GetCatchExceptions() == true)
		{
#if CELERO_HAS_EXCEPTIONS
			try
			{
				return RunAndCatchSEHExc(test, threads, calls, experimentValue);
			}
			catch(const std::exception& e)
			{
				celero::console::SetConsoleColor(celero::console::ConsoleColor::Red);
				std::cout << "C++ exception \"" << e.what() << "\"" << std::endl;
				celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);
			}
			catch(...)
			{
				celero::console::SetConsoleColor(celero::console::ConsoleColor::Red);
				std::cout << "Unknown C++ exception" << std::endl;
				celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);
			}

			return std::make_pair(false, 0);
#else  // CELERO_HAS_EXCEPTIONS
			return RunAndCatchSEHExc(test, threads, calls, experimentValue.get());
#endif // CELERO_HAS_EXCEPTIONS
		}
		else
		{
			return std::make_pair(true, test.run(threads, calls, experimentValue.get()));
		}
	}